

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O1

void __thiscall serialization::json_iarchive::load(json_iarchive *this,int *v)

{
  _Elt_pointer ppGVar1;
  _Elt_pointer ppGVar2;
  undefined8 *puVar3;
  _Elt_pointer ppGVar4;
  
  ppGVar2 = (this->stack_).c.
            super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppGVar2 !=
      (this->stack_).c.
      super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ppGVar1 = (this->stack_).c.
              super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppGVar4 = ppGVar2;
    if (ppGVar2 == ppGVar1) {
      ppGVar4 = (this->stack_).c.
                super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if ((undefined1  [16])
        ((undefined1  [16])ppGVar4[-1]->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      if (ppGVar2 == ppGVar1) {
        ppGVar2 = (this->stack_).c.
                  super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      if ((undefined1  [16])
          ((undefined1  [16])ppGVar2[-1]->data_ & (undefined1  [16])0x20000000000000) !=
          (undefined1  [16])0x0) {
        *v = (ppGVar2[-1]->data_).s.length;
        return;
      }
      __assert_fail("data_.f.flags & kIntFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidjson/document.h"
                    ,0x6c9,
                    "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar3 = &PTR__exception_00120d50;
  puVar3[1] = "expect int";
  puVar3[2] = "json";
  __cxa_throw(puVar3,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

void load(int & v) const
    {
        if(stack_.empty() || (!stack_.top()->IsInt()))
            throw_serialization_error("json", "expect int");
        v = stack_.top()->GetInt();
    }